

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedlist.h
# Opt level: O0

void __thiscall TWeightedList<FDecalBase_*>::RecalcRandomVals(TWeightedList<FDecalBase_*> *this)

{
  ushort uVar1;
  double weightDenom;
  double randVal;
  Choice<FDecalBase_*> *choice;
  int weightSums;
  int numChoices;
  TWeightedList<FDecalBase_*> *this_local;
  
  if (this->Choices != (Choice<FDecalBase_*> *)0x0) {
    choice._0_4_ = 0;
    for (randVal = (double)this->Choices; *(long *)randVal != 0; randVal = *(double *)randVal) {
      choice._0_4_ = (uint)*(ushort *)((long)randVal + 8) + (int)choice;
    }
    uVar1 = *(ushort *)((long)randVal + 8);
    *(undefined1 *)((long)randVal + 10) = 0xff;
    weightDenom = 0.0;
    for (randVal = (double)this->Choices; *(long *)randVal != 0; randVal = *(double *)randVal) {
      weightDenom = weightDenom +
                    (double)*(ushort *)((long)randVal + 8) *
                    (1.0 / (double)(int)((uint)uVar1 + (int)choice));
      *(char *)((long)randVal + 10) = (char)(int)(weightDenom * 255.0);
    }
  }
  return;
}

Assistant:

void TWeightedList<T>::RecalcRandomVals ()
{
	// Redistribute the RandomVals so that they form the correct
	// distribution (as determined by the range of weights).

	int numChoices, weightSums;
	Choice<T> *choice;
	double randVal, weightDenom;

	if (Choices == NULL)
	{ // No choices, so nothing to do.
		return;
	}

	numChoices = 1;
	weightSums = 0;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		++numChoices;
		weightSums += choice->Weight;
	}

	weightSums += choice->Weight;
	choice->RandomVal = 255;	// The last choice is always randomval 255

	randVal = 0.0;
	weightDenom = 1.0 / (double)weightSums;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		randVal += (double)choice->Weight * weightDenom;
		choice->RandomVal = (BYTE)(randVal * 255.0);
	}
}